

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O0

void duckdb::
     LeastGreatestFunction<signed_char,duckdb::LessThan,duckdb::StandardLeastGreatest<false>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong uVar1;
  VectorType VVar2;
  bool bVar3;
  idx_t iVar4;
  reference pvVar5;
  UnifiedVectorFormat *pUVar6;
  bool *pbVar7;
  Vector *pVVar8;
  Vector *in_RDX;
  ExpressionState *in_RSI;
  DataChunk *in_RDI;
  char ivalue_1;
  idx_t vindex_1;
  idx_t i_1;
  char ivalue;
  idx_t vindex;
  idx_t i;
  char *input_data;
  UnifiedVectorFormat vdata;
  idx_t col_idx_1;
  bool result_has_value [2048];
  char *result_data;
  idx_t col_idx;
  VectorType result_type;
  Vector *result_vector;
  DataChunk *input;
  undefined7 in_stack_fffffffffffff6d8;
  undefined1 in_stack_fffffffffffff6df;
  UnifiedVectorFormat *in_stack_fffffffffffff6e0;
  undefined6 in_stack_fffffffffffff6e8;
  undefined1 in_stack_fffffffffffff6ee;
  undefined1 in_stack_fffffffffffff6ef;
  Vector *in_stack_fffffffffffff6f0;
  bool *in_stack_fffffffffffff6f8;
  reference in_stack_fffffffffffff700;
  UnifiedVectorFormat *local_8d0;
  Vector *local_8b8;
  SelectionVector *local_898 [2];
  TemplatedValidityMask<unsigned_long> local_888;
  ulong local_850;
  Vector local_848 [2056];
  char *local_40;
  ulong local_38;
  undefined1 local_29;
  Vector *local_28;
  DataChunk *local_20;
  Vector *local_18;
  ExpressionState *local_10;
  DataChunk *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar4 = DataChunk::ColumnCount((DataChunk *)0xd389fc);
  if (iVar4 == 1) {
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffff6e0,
               CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8));
    duckdb::Vector::Reference(local_18);
  }
  else {
    local_20 = StandardLeastGreatest<false>::Prepare(local_8,local_10);
    local_28 = StandardLeastGreatest<false>::TargetVector(local_18,local_10);
    local_29 = 2;
    for (local_38 = 0; uVar1 = local_38, iVar4 = DataChunk::ColumnCount((DataChunk *)0xd38a9a),
        uVar1 < iVar4; local_38 = local_38 + 1) {
      pvVar5 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffff6e0,
                          CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8));
      VVar2 = Vector::GetVectorType(pvVar5);
      if (VVar2 != CONSTANT_VECTOR) {
        local_29 = 0;
      }
    }
    local_40 = FlatVector::GetData<signed_char>((Vector *)0xd38af5);
    memset(local_848,0,0x800);
    local_850 = 0;
    while( true ) {
      uVar1 = local_850;
      iVar4 = DataChunk::ColumnCount((DataChunk *)0xd38b37);
      if (iVar4 <= uVar1) break;
      pvVar5 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffff6e0,
                          CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8));
      VVar2 = Vector::GetVectorType(pvVar5);
      if (VVar2 == CONSTANT_VECTOR) {
        vector<duckdb::Vector,_true>::operator[]
                  ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffff6e0,
                   CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8));
        bVar3 = ConstantVector::IsNull((Vector *)0xd38b86);
        if (!bVar3) goto LAB_00d38b91;
      }
      else {
LAB_00d38b91:
        duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_898);
        in_stack_fffffffffffff700 =
             vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffff6e0,
                        CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8));
        pUVar6 = (UnifiedVectorFormat *)DataChunk::size(local_20);
        duckdb::Vector::ToUnifiedFormat((ulong)in_stack_fffffffffffff700,pUVar6);
        pbVar7 = (bool *)UnifiedVectorFormat::GetData<signed_char>((UnifiedVectorFormat *)local_898)
        ;
        in_stack_fffffffffffff6f8 = pbVar7;
        bVar3 = TemplatedValidityMask<unsigned_long>::AllValid(&local_888);
        if (bVar3) {
          local_8d0 = (UnifiedVectorFormat *)0x0;
          while (in_stack_fffffffffffff6e0 = local_8d0,
                pUVar6 = (UnifiedVectorFormat *)DataChunk::size(local_20),
                in_stack_fffffffffffff6e0 < pUVar6) {
            iVar4 = SelectionVector::get_index(local_898[0],(idx_t)local_8d0);
            bVar3 = pbVar7[iVar4];
            if ((((byte)local_848[(long)local_8d0] & 1) == 0) ||
               (in_stack_fffffffffffff6df =
                     LessThan::Operation<signed_char>
                               ((char *)in_stack_fffffffffffff6e0,
                                (char *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8
                                                )), (bool)in_stack_fffffffffffff6df)) {
              local_848[(long)local_8d0] = (Vector)0x1;
              local_40[(long)local_8d0] = bVar3;
            }
            local_8d0 = local_8d0 + 1;
          }
        }
        else {
          local_8b8 = (Vector *)0x0;
          while (in_stack_fffffffffffff6f0 = local_8b8, pVVar8 = (Vector *)DataChunk::size(local_20)
                , in_stack_fffffffffffff6f0 < pVVar8) {
            iVar4 = SelectionVector::get_index(local_898[0],(idx_t)local_8b8);
            in_stack_fffffffffffff6ef =
                 TemplatedValidityMask<unsigned_long>::RowIsValid
                           ((TemplatedValidityMask<unsigned_long> *)
                            CONCAT17(in_stack_fffffffffffff6ef,
                                     CONCAT16(in_stack_fffffffffffff6ee,in_stack_fffffffffffff6e8)),
                            (idx_t)in_stack_fffffffffffff6e0);
            if (((bool)in_stack_fffffffffffff6ef) &&
               ((bVar3 = pbVar7[iVar4], ((byte)local_848[(long)local_8b8] & 1) == 0 ||
                (in_stack_fffffffffffff6ee =
                      LessThan::Operation<signed_char>
                                ((char *)in_stack_fffffffffffff6e0,
                                 (char *)CONCAT17(in_stack_fffffffffffff6df,
                                                  in_stack_fffffffffffff6d8)),
                (bool)in_stack_fffffffffffff6ee)))) {
              local_848[(long)local_8b8] = (Vector)0x1;
              local_40[(long)local_8b8] = bVar3;
            }
            local_8b8 = local_8b8 + 1;
          }
        }
        UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffff6e0);
      }
      local_850 = local_850 + 1;
    }
    DataChunk::size(local_20);
    StandardLeastGreatest<false>::FinalizeResult
              ((idx_t)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0,
               (ExpressionState *)
               CONCAT17(in_stack_fffffffffffff6ef,
                        CONCAT16(in_stack_fffffffffffff6ee,in_stack_fffffffffffff6e8)));
    duckdb::Vector::SetVectorType((VectorType)local_18);
  }
  return;
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}